

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O2

void __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
::~basic_rotating_log
          (basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
           *this)

{
  ~basic_rotating_log(this);
  operator_delete(this,0x3b0);
  return;
}

Assistant:

basic_rotating_log<StreamTraits, FileSystemTraits>::~basic_rotating_log () noexcept {
        PSTORE_TRY { this->close (); }